

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void random_read(void *vbuf,size_t size)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (random_seedstr != (char *)0x0) {
    if (size != 0) {
      sVar3 = 0;
      sVar2 = random_buf_limit;
      do {
        sVar1 = sVar2;
        if (sVar2 == 0) {
          random_advance_counter();
          sVar1 = random_buf_limit;
        }
        sVar2 = sVar1 - 1;
        random_buf_limit = sVar2;
        *(uint8_t *)((long)vbuf + sVar3) = random_buf[sVar1];
        sVar3 = sVar3 + 1;
      } while (size != sVar3);
    }
    return;
  }
  __assert_fail("random_seedstr",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testsc.c",
                0x82,"void random_read(void *, size_t)");
}

Assistant:

void random_read(void *vbuf, size_t size)
{
    assert(random_seedstr);
    uint8_t *buf = (uint8_t *)vbuf;
    while (size-- > 0) {
        if (random_buf_limit == 0)
            random_advance_counter();
        *buf++ = random_buf[random_buf_limit--];
    }
}